

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::anon_unknown_3::
     ConvertAll<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
               (UntypedFormatSpecImpl format,
               Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args,
               SummarizingConverter converter)

{
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  consumer;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  consumer_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> pack;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> pack_00;
  bool bVar1;
  ParsedFormatBase *this;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  local_90;
  string_view local_78;
  FormatSinkImpl *local_68;
  pointer local_60;
  FormatSinkImpl *local_58;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  local_50;
  SummarizingConverter local_38;
  SummarizingConverter converter_local;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  
  args_local.len_ = (size_type)format.data_;
  args_local.ptr_ = (pointer)args.len_;
  converter_local.sink_ = (FormatSinkImpl *)args.ptr_;
  local_38.sink_ = converter.sink_;
  bVar1 = UntypedFormatSpecImpl::has_parsed_conversion((UntypedFormatSpecImpl *)&args_local.len_);
  if (bVar1) {
    this = UntypedFormatSpecImpl::parsed_conversion((UntypedFormatSpecImpl *)&args_local.len_);
    local_58 = local_38.sink_;
    local_68 = converter_local.sink_;
    local_60 = args_local.ptr_;
    pack_00.len_ = (size_type)args_local.ptr_;
    pack_00.ptr_ = (pointer)converter_local.sink_;
    ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
    ::ConverterConsumer(&local_50,local_38,pack_00);
    consumer.arg_context_.pack_.ptr_ = local_50.arg_context_.pack_.ptr_;
    consumer.converter_.sink_ = local_50.converter_.sink_;
    consumer.arg_context_.pack_.len_ = local_50.arg_context_.pack_.len_;
    format_local.size_._7_1_ =
         ParsedFormatBase::
         ProcessFormat<absl::lts_20250127::str_format_internal::(anonymous_namespace)::ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>>
                   (this,consumer);
  }
  else {
    local_78 = UntypedFormatSpecImpl::str((UntypedFormatSpecImpl *)&args_local.len_);
    pack.len_ = (size_type)args_local.ptr_;
    pack.ptr_ = (pointer)converter_local.sink_;
    ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
    ::ConverterConsumer(&local_90,local_38,pack);
    consumer_00.arg_context_.pack_.ptr_ = local_90.arg_context_.pack_.ptr_;
    consumer_00.converter_.sink_ = local_90.converter_.sink_;
    consumer_00.arg_context_.pack_.len_ = local_90.arg_context_.pack_.len_;
    format_local.size_._7_1_ =
         ParseFormatString<absl::lts_20250127::str_format_internal::(anonymous_namespace)::ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>>
                   (local_78,consumer_00);
  }
  return format_local.size_._7_1_;
}

Assistant:

bool ConvertAll(const UntypedFormatSpecImpl format,
                absl::Span<const FormatArgImpl> args, Converter converter) {
  if (format.has_parsed_conversion()) {
    return format.parsed_conversion()->ProcessFormat(
        ConverterConsumer<Converter>(converter, args));
  } else {
    return ParseFormatString(format.str(),
                             ConverterConsumer<Converter>(converter, args));
  }
}